

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_block.cpp
# Opt level: O2

BlockTxDataStruct *
cfd::js::api::ElementsBlockStructApi::GetTxDataFromBlock
          (BlockTxDataStruct *__return_storage_ptr__,BlockTxRequestStruct *request)

{
  string *in_R8;
  allocator local_139;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  function<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&)> local_118;
  BlockTxDataStruct local_f8;
  
  BlockTxDataStruct::BlockTxDataStruct(__return_storage_ptr__);
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_120 = std::
              _Function_handler<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_block.cpp:40:7)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_block.cpp:40:7)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_118,"GetTxDataFromBlock",&local_139);
  ExecuteStructApi<cfd::js::api::BlockTxRequestStruct,cfd::js::api::BlockTxDataStruct>
            (&local_f8,(api *)request,(BlockTxRequestStruct *)&local_138,&local_118,in_R8);
  BlockTxDataStruct::operator=(__return_storage_ptr__,&local_f8);
  BlockTxDataStruct::~BlockTxDataStruct(&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::_Function_base::~_Function_base((_Function_base *)&local_138);
  return __return_storage_ptr__;
}

Assistant:

BlockTxDataStruct ElementsBlockStructApi::GetTxDataFromBlock(
    const BlockTxRequestStruct& request) {
  auto call_func =
      [](const BlockTxRequestStruct& request) -> BlockTxDataStruct {
    warn(CFD_LOG_SOURCE, "not implements. txidLen:{}", request.txid.size());
    throw CfdException(CfdError::kCfdIllegalStateError, "Not implements.");
  };

  BlockTxDataStruct result;
  result = ExecuteStructApi<BlockTxRequestStruct, BlockTxDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}